

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_send(Curl_easy *data,void *buffer,size_t buflen,size_t *n)

{
  _Bool _Var1;
  CURLcode CVar2;
  size_t written;
  
  written = 0;
  _Var1 = Curl_is_in_callback(data);
  if (_Var1) {
    CVar2 = CURLE_RECURSIVE_API_CALL;
  }
  else {
    CVar2 = Curl_senddata(data,buffer,buflen,&written);
    *n = written;
  }
  return CVar2;
}

Assistant:

CURLcode curl_easy_send(struct Curl_easy *data, const void *buffer,
                        size_t buflen, size_t *n)
{
  size_t written = 0;
  CURLcode result;
  if(Curl_is_in_callback(data))
    return CURLE_RECURSIVE_API_CALL;

  result = Curl_senddata(data, buffer, buflen, &written);
  *n = written;
  return result;
}